

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_msubr64_h(DisasContext_conflict14 *ctx,TCGv_i32 ret,TCGv_i32 r1_low,TCGv_i32 r1_high,
                  TCGv_i32 r2,TCGv_i32 r3,uint32_t n,uint32_t mode)

{
  TCGContext_conflict9 *tcg_ctx;
  uintptr_t o_2;
  TCGv_i32 arg01;
  uintptr_t o_1;
  TCGv_i32 arg11;
  TCGv_i32 arg00;
  uintptr_t o_5;
  TCGTemp *args [5];
  
  tcg_ctx = ctx->uc->tcg_ctx;
  tcg_const_i32_tricore(tcg_ctx,n);
  tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I64,false);
  tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
  tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
  tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
  (*(code *)(&DAT_00dd34a8 + *(int *)(&DAT_00dd34a8 + (ulong)mode * 4)))();
  return;
}

Assistant:

static inline void
gen_msubr64_h(DisasContext *ctx, TCGv ret, TCGv r1_low, TCGv r1_high, TCGv r2, TCGv r3, uint32_t n,
              uint32_t mode)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    TCGv temp = tcg_const_i32(tcg_ctx, n);
    TCGv_i64 temp64 = tcg_temp_new_i64(tcg_ctx);
    switch (mode) {
    case MODE_LL:
        GEN_HELPER_LL(tcg_ctx, mul_h, temp64, r2, r3, temp);
        break;
    case MODE_LU:
        GEN_HELPER_LU(tcg_ctx, mul_h, temp64, r2, r3, temp);
        break;
    case MODE_UL:
        GEN_HELPER_UL(tcg_ctx, mul_h, temp64, r2, r3, temp);
        break;
    case MODE_UU:
        GEN_HELPER_UU(tcg_ctx, mul_h, temp64, r2, r3, temp);
        break;
    }
    gen_helper_subr_h(tcg_ctx, ret, tcg_ctx->cpu_env, temp64, r1_low, r1_high);

    tcg_temp_free(tcg_ctx, temp);
    tcg_temp_free_i64(tcg_ctx, temp64);
}